

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obs2icrs.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  double dVar2;
  CESkyCoord cirs_coords;
  CESkyCoord obs_coords;
  CEDate date;
  CEObserver observer;
  CEExecOptions opts;
  CEExecOptions *in_stack_fffffffffffff9b0;
  CLOptions *in_stack_fffffffffffff9b8;
  CLOptions *this;
  CEDate local_5a0 [48];
  CESkyCoordType local_570;
  allocator<char> local_569;
  string local_568 [32];
  CEExecOptions *local_548;
  CEAngle local_540 [23];
  allocator local_529;
  string local_528 [32];
  double local_508;
  CEAngle local_500 [16];
  CESkyCoord local_4f0 [55];
  allocator local_4b9;
  string local_4b8 [32];
  CEDate local_498 [71];
  allocator local_451;
  string local_450 [32];
  double local_430;
  allocator local_421;
  string local_420 [32];
  double local_400;
  allocator local_3f1;
  string local_3f0 [32];
  double local_3d0;
  allocator local_3c1;
  string local_3c0 [32];
  double local_3a0;
  CEAngleType local_398;
  allocator local_391;
  string local_390 [32];
  double local_370;
  allocator local_361;
  string local_360 [8];
  char **in_stack_fffffffffffffca8;
  int in_stack_fffffffffffffcb4;
  CLOptions *in_stack_fffffffffffffcb8;
  double local_340;
  allocator local_331;
  string local_330 [32];
  double local_310;
  CEObserver local_308 [32];
  CESkyCoord *in_stack_fffffffffffffd18;
  CEExecOptions *in_stack_fffffffffffffd20;
  
  DefineOpts();
  bVar1 = CLOptions::ParseCommandLine
                    (in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb4,in_stack_fffffffffffffca8);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_330,"longitude",&local_331);
    local_310 = CLOptions::AsDouble(in_stack_fffffffffffff9b8,(string *)in_stack_fffffffffffff9b0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_360,"latitude",&local_361);
    local_340 = CLOptions::AsDouble(in_stack_fffffffffffff9b8,(string *)in_stack_fffffffffffff9b0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_390,"elevation",&local_391);
    local_370 = CLOptions::AsDouble(in_stack_fffffffffffff9b8,(string *)in_stack_fffffffffffff9b0);
    local_398 = DEGREES;
    CEObserver::CEObserver(local_308,&local_310,&local_340,&local_370,&local_398);
    std::__cxx11::string::~string(local_390);
    std::allocator<char>::~allocator((allocator<char> *)&local_391);
    std::__cxx11::string::~string(local_360);
    std::allocator<char>::~allocator((allocator<char> *)&local_361);
    std::__cxx11::string::~string(local_330);
    std::allocator<char>::~allocator((allocator<char> *)&local_331);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3c0,"pressure",&local_3c1);
    local_3a0 = CLOptions::AsDouble(in_stack_fffffffffffff9b8,(string *)in_stack_fffffffffffff9b0);
    CEObserver::SetPressure_hPa(local_308,&local_3a0);
    std::__cxx11::string::~string(local_3c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3f0,"temperature",&local_3f1);
    local_3d0 = CLOptions::AsDouble(in_stack_fffffffffffff9b8,(string *)in_stack_fffffffffffff9b0);
    CEObserver::SetTemperature_C(local_308,&local_3d0);
    std::__cxx11::string::~string(local_3f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_420,"humidity",&local_421);
    local_400 = CLOptions::AsDouble(in_stack_fffffffffffff9b8,(string *)in_stack_fffffffffffff9b0);
    CEObserver::SetRelativeHumidity(local_308,&local_400);
    std::__cxx11::string::~string(local_420);
    std::allocator<char>::~allocator((allocator<char> *)&local_421);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_450,"wavelength",&local_451);
    local_430 = CLOptions::AsDouble(in_stack_fffffffffffff9b8,(string *)in_stack_fffffffffffff9b0);
    CEObserver::SetWavelength_um(local_308,&local_430);
    std::__cxx11::string::~string(local_450);
    std::allocator<char>::~allocator((allocator<char> *)&local_451);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4b8,"juliandate",&local_4b9);
    dVar2 = CLOptions::AsDouble(in_stack_fffffffffffff9b8,(string *)in_stack_fffffffffffff9b0);
    CEDate::CEDate(local_498,dVar2,JD);
    std::__cxx11::string::~string(local_4b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_528,"azimuth",&local_529);
    local_508 = CLOptions::AsDouble(in_stack_fffffffffffff9b8,(string *)in_stack_fffffffffffff9b0);
    CEAngle::Deg((double *)local_500);
    this = (CLOptions *)&local_569;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_568,"zenith",(allocator *)this);
    in_stack_fffffffffffff9b0 =
         (CEExecOptions *)CLOptions::AsDouble(this,(string *)in_stack_fffffffffffff9b0);
    local_548 = in_stack_fffffffffffff9b0;
    CEAngle::Deg((double *)local_540);
    local_570 = OBSERVED;
    CESkyCoord::CESkyCoord(local_4f0,local_500,local_540,&local_570);
    CEAngle::~CEAngle(local_540);
    std::__cxx11::string::~string(local_568);
    std::allocator<char>::~allocator(&local_569);
    CEAngle::~CEAngle(local_500);
    std::__cxx11::string::~string(local_528);
    std::allocator<char>::~allocator((allocator<char> *)&local_529);
    CESkyCoord::ConvertToICRS(local_5a0,(CEObserver *)local_4f0);
    PrintResults(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    CESkyCoord::~CESkyCoord((CESkyCoord *)local_5a0);
    CESkyCoord::~CESkyCoord(local_4f0);
    CEDate::~CEDate(local_498);
    CEObserver::~CEObserver(local_308);
  }
  CEExecOptions::~CEExecOptions(in_stack_fffffffffffff9b0);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
    
    // Parse the command line options
    CEExecOptions opts = DefineOpts() ;
    if (opts.ParseCommandLine(argc, argv)) return 0;
    
    // Define the observer
    CEObserver observer(opts.AsDouble("longitude"),
                        opts.AsDouble("latitude"),
                        opts.AsDouble("elevation"),
                        CEAngleType::DEGREES);
    observer.SetPressure_hPa(opts.AsDouble("pressure"));
    observer.SetTemperature_C(opts.AsDouble("temperature"));
    observer.SetRelativeHumidity(opts.AsDouble("humidity"));
    observer.SetWavelength_um(opts.AsDouble("wavelength"));

    // Define the date
    CEDate date(opts.AsDouble("juliandate"), CEDateType::JD);

    // Convert the coordinates
    CESkyCoord obs_coords(CEAngle::Deg(opts.AsDouble("azimuth")),
                          CEAngle::Deg(opts.AsDouble("zenith")),
                          CESkyCoordType::OBSERVED);
    CESkyCoord cirs_coords = obs_coords.ConvertToICRS(date, observer);

    // Print the results
    PrintResults(opts, cirs_coords);
    
    return 0;
}